

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

_Bool rf_check_collision_recs(rf_rec rec1,rf_rec rec2)

{
  _Bool _Var1;
  
  _Var1 = false;
  if ((rec1.x < rec2.x + rec2.width) && (_Var1 = false, rec2.x < rec1.x + rec1.width)) {
    _Var1 = (_Bool)(-(rec1.y < rec2.height + rec2.y) & rec2.y < rec1.height + rec1.y);
  }
  return _Var1;
}

Assistant:

bool rf_check_collision_recs(rf_rec rec1, rf_rec rec2)
{
    bool collision = false;

    if ((rec1.x < (rec2.x + rec2.width) && (rec1.x + rec1.width) > rec2.x) &&
        (rec1.y < (rec2.y + rec2.height) && (rec1.y + rec1.height) > rec2.y))
        collision = true;

    return collision;
}